

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

id_type __thiscall Darts::Details::DawgBuilder::hash_node(DawgBuilder *this,id_type id)

{
  byte bVar1;
  id_type iVar2;
  DawgNode *pDVar3;
  id_type in_ESI;
  AutoPool<Darts::Details::DawgNode> *in_RDI;
  uchar_type label;
  id_type unit;
  id_type hash_value;
  size_t in_stack_ffffffffffffffd8;
  undefined4 local_10;
  undefined4 local_c;
  
  local_10 = 0;
  local_c = in_ESI;
  while (local_c != 0) {
    pDVar3 = AutoPool<Darts::Details::DawgNode>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    iVar2 = DawgNode::unit(pDVar3);
    pDVar3 = AutoPool<Darts::Details::DawgNode>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    bVar1 = DawgNode::label(pDVar3);
    iVar2 = hash((uint)bVar1 << 0x18 ^ iVar2);
    local_10 = iVar2 ^ local_10;
    pDVar3 = AutoPool<Darts::Details::DawgNode>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    local_c = DawgNode::sibling(pDVar3);
  }
  return local_10;
}

Assistant:

inline id_type DawgBuilder::hash_node(id_type id) const {
  id_type hash_value = 0;
  for ( ; id != 0; id = nodes_[id].sibling()) {
    id_type unit = nodes_[id].unit();
    uchar_type label = nodes_[id].label();
    hash_value ^= hash((label << 24) ^ unit);
  }
  return hash_value;
}